

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::FileGenerator::CreateHeaderInclude
          (string *__return_storage_ptr__,FileGenerator *this,string *basename,FileDescriptor *file)

{
  bool bVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  allocator local_c9;
  undefined1 local_c8 [8];
  string right;
  undefined1 local_a0 [8];
  string left;
  undefined1 local_50 [8];
  string name;
  bool use_system_include;
  FileDescriptor *file_local;
  string *basename_local;
  FileGenerator *this_local;
  
  name.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)local_50,(string *)basename);
  if ((((this->options_).opensource_runtime & 1U) != 0) && (bVar1 = IsWellKnownMessage(file), bVar1)
     ) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&left.field_2 + 8),&(this->options_).runtime_include_base,basename);
      std::__cxx11::string::operator=((string *)local_50,(string *)(left.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(left.field_2._M_local_buf + 8));
    }
    else {
      name.field_2._M_local_buf[0xf] = '\x01';
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_a0,"\"",(allocator *)(right.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(right.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_c8,"\"",&local_c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  if ((name.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::operator=((string *)local_a0,"<");
    std::__cxx11::string::operator=((string *)local_c8,">");
  }
  std::operator+(&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  std::operator+(__return_storage_ptr__,&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string FileGenerator::CreateHeaderInclude(const std::string& basename,
                                               const FileDescriptor* file) {
  bool use_system_include = false;
  std::string name = basename;

  if (options_.opensource_runtime) {
    if (IsWellKnownMessage(file)) {
      if (options_.runtime_include_base.empty()) {
        use_system_include = true;
      } else {
        name = options_.runtime_include_base + basename;
      }
    }
  }

  std::string left = "\"";
  std::string right = "\"";
  if (use_system_include) {
    left = "<";
    right = ">";
  }
  return left + name + right;
}